

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O2

void __thiscall
p2t::Sweep::FillRightConvexEdgeEvent(Sweep *this,SweepContext *tcx,Edge *edge,Node *node)

{
  Node *pNVar1;
  Point *pc;
  Orientation OVar2;
  Node *node_00;
  Point *pa;
  Point *pb;
  Node *pNVar3;
  
  node_00 = node->next;
  pa = node_00->point;
  pb = node_00->next->point;
  pNVar3 = node_00->next;
  do {
    pNVar1 = pNVar3->next;
    pc = pNVar1->point;
    OVar2 = Orient2d(pa,pb,pc);
    if (OVar2 == CCW) {
      FillRightConcaveEdgeEvent(this,tcx,edge,node_00);
      return;
    }
    OVar2 = Orient2d(edge->q,pb,edge->p);
    node_00 = pNVar3;
    pa = pb;
    pb = pc;
    pNVar3 = pNVar1;
  } while (OVar2 == CCW);
  return;
}

Assistant:

void Sweep::FillRightConvexEdgeEvent(SweepContext& tcx, Edge* edge, Node& node)
{
  // Next concave or convex?
  if (Orient2d(*node.next->point, *node.next->next->point, *node.next->next->next->point) == CCW) {
    // Concave
    FillRightConcaveEdgeEvent(tcx, edge, *node.next);
  } else{
    // Convex
    // Next above or below edge?
    if (Orient2d(*edge->q, *node.next->next->point, *edge->p) == CCW) {
      // Below
      FillRightConvexEdgeEvent(tcx, edge, *node.next);
    } else{
      // Above
    }
  }
}